

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O0

int __thiscall
icu_63::DateTimeRule::clone
          (DateTimeRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DateTimeRule *this_00;
  undefined8 local_30;
  DateTimeRule *this_local;
  
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  local_30 = (DateTimeRule *)0x0;
  if (this_00 != (DateTimeRule *)0x0) {
    DateTimeRule(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

DateTimeRule*
DateTimeRule::clone() const {
    return new DateTimeRule(*this);
}